

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O2

string * __thiscall
BayesianGameBase::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,BayesianGameBase *this)

{
  ostream *poVar1;
  double *pdVar2;
  ostream *poVar3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  string *this_00;
  double *pdVar6;
  stringstream ss_1;
  stringstream ss;
  string local_508 [32];
  string local_4e8 [32];
  undefined1 local_4c8 [392];
  stringstream local_340 [16];
  ostream local_330 [376];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  SoftPrintSummary_abi_cxx11_((string *)local_4c8,this);
  std::operator<<(local_1a8,(string *)local_4c8);
  std::__cxx11::string::~string((string *)local_4c8);
  std::operator<<(local_1a8,"joint type probs ");
  if (this->_m_useSparse == true) {
    poVar3 = std::operator<<(local_1a8,"(sparse) ");
    std::__cxx11::stringstream::stringstream((stringstream *)local_4c8);
    p_Var5 = *(_Base_ptr *)
              ((long)&(this->_m_jTypeProbsSparse).data_.
                      super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                      ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    poVar1 = (ostream *)(local_4c8 + 0x10);
    std::operator<<(poVar1,"< ");
    for (; (_Rb_tree_header *)p_Var5 !=
           &(this->_m_jTypeProbsSparse).data_.
            super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      if (p_Var5 != *(_Base_ptr *)
                     ((long)&(this->_m_jTypeProbsSparse).data_.
                             super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                             ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10)) {
        std::operator<<(poVar1,", ");
      }
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar4,":");
      std::ostream::_M_insert<double>((double)p_Var5[1]._M_parent);
    }
    std::operator<<(poVar1," >");
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_4c8);
    std::operator<<(poVar3,(string *)local_340);
    this_00 = (string *)local_340;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_340);
    pdVar6 = (this->_m_jTypeProbs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->_m_jTypeProbs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    std::operator<<(local_330,"< ");
    for (; pdVar6 != pdVar2; pdVar6 = pdVar6 + 1) {
      if (pdVar6 != (this->_m_jTypeProbs).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
        std::operator<<(local_330,", ");
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_4c8);
      std::ostream::_M_insert<double>(*pdVar6);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_4c8);
      std::operator<<(local_330,local_4e8);
      std::__cxx11::string::~string(local_4e8);
    }
    std::operator<<(local_330," >");
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_340);
    std::operator<<(local_1a8,local_508);
    this_00 = local_508;
  }
  std::__cxx11::string::~string(this_00);
  std::endl<char,std::char_traits<char>>(local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

string BayesianGameBase::SoftPrint() const
{
    stringstream ss;
    ss << this->SoftPrintSummary();
/*  
    ss << "Bayesian game with "<<_m_nrAgents<<" agents"<<endl;
    ss << "Number of actions ";
    ss << SoftPrintVector(_m_nrActions);
    ss << " ("<< _m_nrJA <<" joint actions)";
    ss << "\nNumber of types ";
    ss << SoftPrintVector(_m_nrTypes);
    ss << " ("<< _m_nrJTypes <<" joint types)"<<endl;
*/    
    ss << "joint type probs ";
    if(_m_useSparse)
        ss << "(sparse) " << SoftPrintVector(_m_jTypeProbsSparse);
    else
        ss << SoftPrintVector(_m_jTypeProbs);
    ss << endl;
    return(ss.str());
}